

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

int Gia_ManBmcPerform_Unr(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  Bmc_Mna_t *p;
  Gia_Man_t *pGVar7;
  undefined4 extraout_var;
  Vec_Int_t *pVVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  double dVar16;
  int Lit;
  ulong local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  Unr_Man_t *local_60;
  timespec ts;
  
  uVar12 = pPars->nFramesMax;
  p = Bmc_MnaAlloc();
  local_60 = Unr_ManUnrollStart(pGia,pPars->fVeryVerbose);
  uVar6 = uVar12;
  if ((int)uVar12 < 1) {
    uVar6 = 0;
  }
  local_70 = 1000000000;
  if (uVar12 != 0) {
    local_70 = uVar6;
  }
  uVar14 = 0;
  uVar12 = 0;
  do {
    if (uVar12 == local_70) goto LAB_0056f3cc;
    pGVar7 = Unr_ManUnrollFrame(local_60,uVar12);
    p->pFrames = pGVar7;
    iVar9 = pGia->vCos->nSize - pGia->nRegs;
    uVar15 = uVar12 + 1;
    iVar9 = Gia_ManBmcCheckOutputs(pGVar7,iVar9 * uVar12,iVar9 * uVar15);
    uVar6 = 0xfffffffe;
    local_78 = (ulong)uVar12;
    if (iVar9 == 0) {
      iVar9 = pGia->vCos->nSize - pGia->nRegs;
      Gia_ManBmcAddCone(p,iVar9 * uVar12,iVar9 * uVar15);
      Gia_ManBmcAddCnf(p,p->pFrames,p->vInputs,p->vNodes,p->vOutputs);
      iVar9 = pGia->nRegs;
      pVVar8 = pGia->vCos;
      iVar10 = pVVar8->nSize - iVar9;
      uVar12 = iVar10 * uVar12;
      if ((int)uVar12 < (int)(iVar10 * uVar15)) {
        uVar14 = (ulong)uVar12;
        do {
          pGVar7 = p->pFrames;
          iVar10 = pGVar7->vCos->nSize;
          if (iVar10 - pGVar7->nRegs <= (int)uVar14) {
            __assert_fail("v < Gia_ManPoNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
          }
          if (((int)uVar12 < 0) || (iVar10 <= (int)uVar14)) {
LAB_0056f4fc:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar10 = pGVar7->vCos->pArray[uVar14];
          lVar11 = (long)iVar10;
          if ((lVar11 < 0) || (pGVar7->nObjs <= iVar10)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar1 = pGVar7->pObjs + lVar11;
          uVar6 = (uint)*(undefined8 *)pGVar1;
          if (pGVar7->pObjs !=
              (Gia_Obj_t *)
              ((ulong)(uVar6 >> 0x1d & 1) ^ (ulong)(pGVar1 + -(ulong)(uVar6 & 0x1fffffff)))) {
            if (p->vId2Var->nSize <= iVar10) goto LAB_0056f4fc;
            iVar9 = p->vId2Var->pArray[lVar11];
            if (iVar9 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            Lit = iVar9 * 2;
            iVar9 = sat_solver_solve(p->pSat,&Lit,(lit *)&local_78,(long)pPars->nConfLimit,0,0,0);
            if (iVar9 != -1) {
              uVar6 = 0;
              if (iVar9 != 1) {
                uVar6 = iVar9 == 0 | 0xfffffffe;
              }
              goto LAB_0056f265;
            }
            iVar9 = pGia->nRegs;
            pVVar8 = pGia->vCos;
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < (int)((pVVar8->nSize - iVar9) * uVar15));
      }
      else {
        uVar14 = (ulong)uVar12;
      }
      uVar6 = 0xfffffffe;
    }
LAB_0056f265:
    uVar12 = uVar15;
    if (pPars->fVerbose != 0) {
      pGVar7 = p->pFrames;
      iVar9 = pGVar7->vCis->nSize;
      iVar10 = pGVar7->nRegs;
      iVar13 = pGVar7->vCos->nSize;
      iVar2 = pGVar7->nObjs;
      iVar3 = p->nSatVars;
      local_6c = p->vInputs->nSize;
      uVar12 = p->vNodes->nSize;
      local_68 = uVar6;
      local_64 = uVar15;
      iVar5 = sat_solver_nclauses(p->pSat);
      uVar6 = sat_solver_nconflicts(p->pSat);
      dVar16 = Gia_ManMemory(p->pFrames);
      printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
             ,dVar16 * 9.5367431640625e-07,local_78,(ulong)(uint)(iVar9 - iVar10),
             (ulong)(uint)(~(iVar9 + iVar13) + iVar2),(ulong)(iVar3 - 1),(ulong)local_6c,
             (ulong)uVar12,CONCAT44(extraout_var,iVar5),(ulong)uVar6);
      iVar10 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      lVar4 = p->clkStart;
      Abc_Print(iVar10,"%s =","Time");
      Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar11 - lVar4) / 1000000.0);
      uVar12 = local_64;
      uVar6 = local_68;
    }
  } while (uVar6 == 0xfffffffe);
  if (uVar6 == 0xffffffff) {
    printf("SAT solver reached conflict/runtime limit in frame %d.\n",local_78);
LAB_0056f3cc:
    iVar10 = -1;
  }
  else {
    iVar10 = 0;
    printf("Output %d of miter \"%s\" was asserted in frame %d.  ",
           (ulong)(uint)((pGia->nRegs - pGia->vCos->nSize) * (int)local_78 + (int)uVar14),
           pGia->pName);
    iVar13 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar4 = p->clkStart;
    Abc_Print(iVar13,"%s =","Time");
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar11 - lVar4) / 1000000.0);
  }
  if (pPars->fDumpFrames != 0) {
    pGVar7 = Gia_ManCleanup(p->pFrames);
    p->pFrames = pGVar7;
    Gia_AigerWrite(pGVar7,"frames.aig",0,0,0);
    puts("Dumped unfolded frames into file \"frames.aig\".");
    Gia_ManStop(p->pFrames);
  }
  Unr_ManFree(local_60);
  Bmc_MnaFree(p);
  return iVar10;
}

Assistant:

int Gia_ManBmcPerform_Unr( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Unr_Man_t * pUnroll;
    Bmc_Mna_t * p;
    int nFramesMax = pPars->nFramesMax ? pPars->nFramesMax : ABC_INFINITY;
    int f, i=0, Lit, status, RetValue = -2;
    p = Bmc_MnaAlloc();
    pUnroll = Unr_ManUnrollStart( pGia, pPars->fVeryVerbose );
    for ( f = 0; f < nFramesMax; f++ )
    {
        p->pFrames = Unr_ManUnrollFrame( pUnroll, f );
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCone( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // create CNF in the SAT solver
            Gia_ManBmcAddCnf( p, p->pFrames, p->vInputs, p->vNodes, p->vOutputs );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True ) // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
        }
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // dump unfolded frames
    if ( pPars->fDumpFrames )
    {
        p->pFrames = Gia_ManCleanup( p->pFrames );
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
        Gia_ManStop( p->pFrames );
    }
    // cleanup
    Unr_ManFree( pUnroll );
    Bmc_MnaFree( p );
    return RetValue;
}